

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O2

bool __thiscall
BasePort::WriteBlock(BasePort *this,uchar boardId,nodeaddr_t addr,quadlet_t *wdata,uint nbytes)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  ostream *poVar4;
  byte bVar5;
  char *pcVar6;
  
  if (nbytes != 0) {
    if (nbytes == 4) {
      iVar2 = (*this->_vptr_BasePort[0x24])(this,boardId,addr,(ulong)*wdata);
      return SUB41(iVar2,0);
    }
    if ((nbytes & 3) == 0) {
      uVar3 = (*this->_vptr_BasePort[0x1a])(this);
      if (nbytes <= uVar3) {
        bVar5 = boardId & 0x3f;
        if (bVar5 < 0x10) {
          uVar1 = this->Board2Node[bVar5];
          if (0x3f < uVar1) {
            return false;
          }
        }
        else {
          uVar1 = 0x3f;
          if (bVar5 != 0x3f) {
            return false;
          }
        }
        iVar2 = (*this->_vptr_BasePort[6])
                          (this,(ulong)uVar1,addr,wdata,nbytes,(ulong)(boardId & 0xc0));
        return SUB41(iVar2,0);
      }
      poVar4 = std::operator<<(this->outStr,"BasePort::WriteBlock: packet size ");
      *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
           *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 2;
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      poVar4 = std::operator<<(poVar4," too large (max = ");
      (*this->_vptr_BasePort[0x1a])(this);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      pcVar6 = " bytes)";
      goto LAB_0010a85f;
    }
  }
  poVar4 = std::operator<<(this->outStr,"BasePort::WriteBlock: illegal size (");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  pcVar6 = "), must be multiple of 4";
LAB_0010a85f:
  poVar4 = std::operator<<(poVar4,pcVar6);
  std::endl<char,std::char_traits<char>>(poVar4);
  return false;
}

Assistant:

bool BasePort::WriteBlock(unsigned char boardId, nodeaddr_t addr, quadlet_t *wdata,
                              unsigned int nbytes)
{
    if (nbytes == 4) {
        return WriteQuadlet(boardId, addr, *wdata);
    }
    else if ((nbytes == 0) || ((nbytes%4) != 0)) {
        outStr << "BasePort::WriteBlock: illegal size (" << nbytes << "), must be multiple of 4" << std::endl;
        return false;
    }
    else if (nbytes > GetMaxWriteDataSize()) {
        outStr << "BasePort::WriteBlock: packet size " << std::dec << nbytes << " too large (max = "
               << GetMaxWriteDataSize() << " bytes)" << std::endl;
        return false;
    }

    nodeid_t node = ConvertBoardToNode(boardId);
    return (node < MAX_NODES) ? WriteBlockNode(node, addr, wdata, nbytes, boardId&FW_NODE_FLAGS_MASK) : false;
}